

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

int Aig_ManChoiceNum(Aig_Man_t *p)

{
  void *pvVar1;
  uint uVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if ((pvVar1 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar1 + 0x18) & 7) - 7)) {
      uVar2 = 0;
      if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
         (uVar2 = 0, p->pEquivs[*(int *)((long)pvVar1 + 0x24)] != (Aig_Obj_t *)0x0)) {
        uVar2 = (uint)((*(ulong *)((long)pvVar1 + 0x18) & 0xffffffc0) != 0);
      }
      iVar3 = iVar3 + uVar2;
    }
  }
  return iVar3;
}

Assistant:

int Aig_ManChoiceNum( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        Counter += Aig_ObjIsChoice( p, pObj );
    return Counter;
}